

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O1

void dr_prediction_z1_32xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  int iVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  uint uVar12;
  ulong uVar13;
  short sVar14;
  short sVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar18 [16];
  ushort uVar19;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ushort uVar28;
  ushort uVar29;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar30 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar38 [16];
  __m128i dstvec [64];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined8 local_838 [128];
  undefined8 local_438 [129];
  
  uVar2 = (ulong)(uint)N;
  if (0 < N) {
    auVar17 = pshufb(ZEXT116(above[(long)N + 0x1f]),(undefined1  [16])0x0);
    puVar10 = local_438;
    puVar11 = local_838;
    uVar5 = 0;
    auVar18 = pmovsxbw(in_XMM3,0x1010101010101010);
    uVar13 = uVar2;
    uVar6 = upsample_above;
    do {
      iVar8 = (int)uVar6 >> 6;
      uVar12 = (N + 0x1f) - iVar8;
      if (uVar12 == 0 || N + 0x1f < iVar8) {
        lVar4 = 0;
        uVar9 = uVar13;
        do {
          *(undefined1 (*) [16])((long)puVar10 + lVar4) = auVar17;
          *(undefined1 (*) [16])((long)puVar11 + lVar4) = auVar17;
          lVar4 = lVar4 + 0x10;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      else {
        auVar15 = ZEXT416(uVar6 >> 1 & 0x1f);
        auVar15 = pshuflw(auVar15,auVar15,0);
        uVar9 = 0;
        do {
          auVar30 = auVar17;
          if (uVar9 < uVar12) {
            auVar30 = *(undefined1 (*) [16])(above + uVar9 + (long)iVar8);
            auVar1 = *(undefined1 (*) [16])(above + uVar9 + (long)iVar8 + 1);
            auVar20 = pmovzxbw(auVar17,auVar30);
            auVar38 = pmovzxbw(in_XMM7,auVar1);
            auVar21 = psllw(auVar20,5);
            sVar14 = auVar15._0_2_;
            in_XMM7._0_2_ = (auVar38._0_2_ - auVar20._0_2_) * sVar14;
            sVar16 = auVar15._2_2_;
            in_XMM7._2_2_ = (auVar38._2_2_ - auVar20._2_2_) * sVar16;
            in_XMM7._4_2_ = (auVar38._4_2_ - auVar20._4_2_) * sVar14;
            in_XMM7._6_2_ = (auVar38._6_2_ - auVar20._6_2_) * sVar16;
            in_XMM7._8_2_ = (auVar38._8_2_ - auVar20._8_2_) * sVar14;
            in_XMM7._10_2_ = (auVar38._10_2_ - auVar20._10_2_) * sVar16;
            in_XMM7._12_2_ = (auVar38._12_2_ - auVar20._12_2_) * sVar14;
            in_XMM7._14_2_ = (auVar38._14_2_ - auVar20._14_2_) * sVar16;
            uVar19 = (ushort)(auVar21._0_2_ + auVar18._0_2_ + in_XMM7._0_2_) >> 5;
            uVar22 = (ushort)(auVar21._2_2_ + auVar18._2_2_ + in_XMM7._2_2_) >> 5;
            uVar23 = (ushort)(auVar21._4_2_ + auVar18._4_2_ + in_XMM7._4_2_) >> 5;
            uVar24 = (ushort)(auVar21._6_2_ + auVar18._6_2_ + in_XMM7._6_2_) >> 5;
            uVar25 = (ushort)(auVar21._8_2_ + auVar18._8_2_ + in_XMM7._8_2_) >> 5;
            uVar26 = (ushort)(auVar21._10_2_ + auVar18._10_2_ + in_XMM7._10_2_) >> 5;
            uVar27 = (ushort)(auVar21._12_2_ + auVar18._12_2_ + in_XMM7._12_2_) >> 5;
            uVar28 = (ushort)(auVar21._14_2_ + auVar18._14_2_ + in_XMM7._14_2_) >> 5;
            auVar20._0_2_ = CONCAT11(0,auVar30[8]);
            auVar20[2] = auVar30[9];
            auVar20[3] = 0;
            auVar20[4] = auVar30[10];
            auVar20[5] = 0;
            auVar20[6] = auVar30[0xb];
            auVar20[7] = 0;
            auVar20[8] = auVar30[0xc];
            auVar20[9] = 0;
            auVar20[10] = auVar30[0xd];
            auVar20[0xb] = 0;
            auVar20[0xc] = auVar30[0xe];
            auVar20[0xd] = 0;
            auVar20[0xe] = auVar30[0xf];
            auVar20[0xf] = 0;
            auVar21 = psllw(auVar20,5);
            uVar29 = (ushort)(auVar21._0_2_ + auVar18._0_2_ + (auVar1[8] - auVar20._0_2_) * sVar14)
                     >> 5;
            uVar31 = (ushort)(auVar21._2_2_ + auVar18._2_2_ +
                             ((ushort)auVar1[9] - (ushort)auVar30[9]) * sVar16) >> 5;
            uVar32 = (ushort)(auVar21._4_2_ + auVar18._4_2_ +
                             ((ushort)auVar1[10] - (ushort)auVar30[10]) * sVar14) >> 5;
            uVar33 = (ushort)(auVar21._6_2_ + auVar18._6_2_ +
                             ((ushort)auVar1[0xb] - (ushort)auVar30[0xb]) * sVar16) >> 5;
            uVar34 = (ushort)(auVar21._8_2_ + auVar18._8_2_ +
                             ((ushort)auVar1[0xc] - (ushort)auVar30[0xc]) * sVar14) >> 5;
            uVar35 = (ushort)(auVar21._10_2_ + auVar18._10_2_ +
                             ((ushort)auVar1[0xd] - (ushort)auVar30[0xd]) * sVar16) >> 5;
            uVar36 = (ushort)(auVar21._12_2_ + auVar18._12_2_ +
                             ((ushort)auVar1[0xe] - (ushort)auVar30[0xe]) * sVar14) >> 5;
            uVar37 = (ushort)(auVar21._14_2_ + auVar18._14_2_ +
                             ((ushort)auVar1[0xf] - (ushort)auVar30[0xf]) * sVar16) >> 5;
            auVar30[1] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
            auVar30[0] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
            auVar30[2] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
            auVar30[3] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
            auVar30[4] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
            auVar30[5] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
            auVar30[6] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
            auVar30[7] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
            auVar30[8] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
            auVar30[9] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
            auVar30[10] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
            auVar30[0xb] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
            auVar30[0xc] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
            auVar30[0xd] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
            auVar30[0xe] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
            auVar30[0xf] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
          }
          *(undefined1 (*) [16])(local_858 + uVar9) = auVar30;
          uVar9 = uVar9 + 0x10;
        } while (uVar9 == 0x10);
        uVar9 = 0x20;
        if ((int)uVar12 < 0x20) {
          uVar9 = (ulong)uVar12;
        }
        auVar15 = pblendvb(auVar17,local_858,(undefined1  [16])Mask[0][uVar9]);
        auVar30 = pblendvb(auVar17,local_848,(undefined1  [16])Mask[1][uVar9]);
        *(undefined1 (*) [16])(local_438 + uVar5 * 2) = auVar15;
        *(undefined1 (*) [16])(local_838 + uVar5 * 2) = auVar30;
        uVar6 = uVar6 + upsample_above;
      }
      if ((int)uVar12 < 1) break;
      uVar5 = uVar5 + 1;
      puVar10 = puVar10 + 2;
      puVar11 = puVar11 + 2;
      uVar13 = uVar13 - 1;
    } while (uVar5 != uVar2);
  }
  if (0 < N) {
    puVar7 = dst + 0x10;
    lVar4 = 0;
    do {
      uVar3 = *(undefined8 *)((long)local_438 + lVar4 + 8);
      *(undefined8 *)(puVar7 + -0x10) = *(undefined8 *)((long)local_438 + lVar4);
      *(undefined8 *)(puVar7 + -8) = uVar3;
      uVar3 = *(undefined8 *)((long)local_838 + lVar4 + 8);
      *(undefined8 *)puVar7 = *(undefined8 *)((long)local_838 + lVar4);
      *(undefined8 *)(puVar7 + 8) = uVar3;
      lVar4 = lVar4 + 0x10;
      puVar7 = puVar7 + stride;
    } while (uVar2 << 4 != lVar4);
  }
  return;
}

Assistant:

static void dr_prediction_z1_32xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *above,
                                         int upsample_above, int dx) {
  __m128i dstvec[64], dstvec_h[64];
  dr_prediction_z1_32xN_internal_sse4_1(N, dstvec, dstvec_h, above,
                                        upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm_storeu_si128((__m128i *)(dst + stride * i), dstvec[i]);
    _mm_storeu_si128((__m128i *)(dst + stride * i + 16), dstvec_h[i]);
  }
}